

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSVparser.cpp
# Opt level: O1

ofstream * csv::operator<<(ofstream *os,Row *row)

{
  pointer pbVar1;
  uint uVar2;
  ulong uVar3;
  
  pbVar1 = (row->_values).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((row->_values).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar1) {
    uVar2 = 1;
    uVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)os,pbVar1[uVar3]._M_dataplus._M_p,pbVar1[uVar3]._M_string_length);
      if (uVar3 < ((long)(row->_values).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)(row->_values).
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)os,",",1);
      }
      uVar3 = (ulong)uVar2;
      pbVar1 = (row->_values).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar2 = uVar2 + 1;
    } while ((long)(row->_values).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5 != uVar3);
  }
  return os;
}

Assistant:

std::ofstream &operator<<(std::ofstream &os, const Row &row)
  {
    for (unsigned int i = 0; i != row._values.size(); i++)
    {
        os << row._values[i];
        if (i < row._values.size() - 1)
          os << ",";
    }
    return os;
  }